

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_getHighsLpData
                   (HighsLp *lp,HighsInt a_format,HighsInt *num_col,HighsInt *num_row,
                   HighsInt *num_nz,HighsInt *sense,double *offset,double *col_cost,
                   double *col_lower,double *col_upper,double *row_lower,double *row_upper,
                   HighsInt *a_start,HighsInt *a_index,double *a_value,HighsInt *integrality)

{
  HighsSparseMatrix *this;
  pointer pHVar1;
  uint uVar2;
  bool bVar3;
  HighsInt HVar4;
  long lVar5;
  HighsSparseMatrix local_a0;
  
  *sense = lp->sense_;
  *offset = lp->offset_;
  *num_col = lp->num_col_;
  *num_row = lp->num_row_;
  *num_nz = 0;
  if (0 < (long)*num_col) {
    if (col_cost != (double *)0x0) {
      memcpy(col_cost,(lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,(long)*num_col << 3);
    }
    if (col_lower != (double *)0x0) {
      memcpy(col_lower,
             (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,(long)*num_col << 3);
    }
    if (col_upper != (double *)0x0) {
      memcpy(col_upper,
             (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,(long)*num_col << 3);
    }
  }
  if (0 < (long)*num_row) {
    if (row_lower != (double *)0x0) {
      memcpy(row_lower,
             (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,(long)*num_row << 3);
    }
    if (row_upper != (double *)0x0) {
      memcpy(row_upper,
             (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,(long)*num_row << 3);
    }
  }
  if ((*num_col < 1) || (*num_row < 1)) goto LAB_0021838e;
  this = &lp->a_matrix_;
  uVar2 = *num_row;
  if (a_format == 1) {
    uVar2 = *num_col;
  }
  if (a_format != 1) {
    bVar3 = HighsSparseMatrix::isRowwise(this);
    if (bVar3) goto LAB_00218295;
    HighsSparseMatrix::HighsSparseMatrix(&local_a0,this);
    HighsSparseMatrix::ensureRowwise(&local_a0);
  }
  else {
    bVar3 = HighsSparseMatrix::isColwise(this);
    if (bVar3) {
LAB_00218295:
      HVar4 = HighsSparseMatrix::numNz(this);
      *num_nz = HVar4;
      if (a_start != (HighsInt *)0x0) {
        memcpy(a_start,(lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,(ulong)uVar2 << 2);
      }
      if (a_index != (HighsInt *)0x0) {
        memcpy(a_index,(lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,(long)*num_nz << 2);
      }
      if (a_value != (double *)0x0) {
        memcpy(a_value,(lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start,(long)*num_nz << 3);
      }
      goto LAB_0021838e;
    }
    HighsSparseMatrix::HighsSparseMatrix(&local_a0,this);
    HighsSparseMatrix::ensureColwise(&local_a0);
  }
  HVar4 = HighsSparseMatrix::numNz(&local_a0);
  *num_nz = HVar4;
  if (a_start != (HighsInt *)0x0) {
    memcpy(a_start,local_a0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,(ulong)uVar2 << 2);
  }
  if (a_index != (HighsInt *)0x0) {
    memcpy(a_index,local_a0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,(long)*num_nz << 2);
  }
  if (a_value != (double *)0x0) {
    memcpy(a_value,local_a0.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,(long)*num_nz << 3);
  }
  HighsSparseMatrix::~HighsSparseMatrix(&local_a0);
LAB_0021838e:
  if ((integrality != (HighsInt *)0x0) &&
     (pHVar1 = (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
               _M_impl.super__Vector_impl_data._M_start,
     *(int *)&(lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
              _M_impl.super__Vector_impl_data._M_finish != (int)pHVar1)) {
    for (lVar5 = 0; lVar5 < *num_col; lVar5 = lVar5 + 1) {
      integrality[lVar5] = (uint)pHVar1[lVar5];
    }
  }
  return 0;
}

Assistant:

HighsInt Highs_getHighsLpData(const HighsLp& lp, const HighsInt a_format,
                              HighsInt* num_col, HighsInt* num_row,
                              HighsInt* num_nz, HighsInt* sense, double* offset,
                              double* col_cost, double* col_lower,
                              double* col_upper, double* row_lower,
                              double* row_upper, HighsInt* a_start,
                              HighsInt* a_index, double* a_value,
                              HighsInt* integrality) {
  const MatrixFormat desired_a_format =
      a_format == HighsInt(MatrixFormat::kColwise) ? MatrixFormat::kColwise
                                                   : MatrixFormat::kRowwise;
  *sense = (HighsInt)lp.sense_;
  *offset = lp.offset_;
  *num_col = lp.num_col_;
  *num_row = lp.num_row_;
  *num_nz = 0;  // In case one of the matrix dimensions is zero
  if (*num_col > 0) {
    if (col_cost)
      memcpy(col_cost, lp.col_cost_.data(), *num_col * sizeof(double));
    if (col_lower)
      memcpy(col_lower, lp.col_lower_.data(), *num_col * sizeof(double));
    if (col_upper)
      memcpy(col_upper, lp.col_upper_.data(), *num_col * sizeof(double));
  }
  if (*num_row > 0) {
    if (row_lower)
      memcpy(row_lower, lp.row_lower_.data(), *num_row * sizeof(double));
    if (row_upper)
      memcpy(row_upper, lp.row_upper_.data(), *num_row * sizeof(double));
  }

  // Nothing to do if one of the matrix dimensions is zero
  if (*num_col > 0 && *num_row > 0) {
    // Determine the desired orientation and number of start entries to
    // be copied
    const HighsInt num_start_entries =
        desired_a_format == MatrixFormat::kColwise ? *num_col : *num_row;
    if ((desired_a_format == MatrixFormat::kColwise &&
         lp.a_matrix_.isColwise()) ||
        (desired_a_format == MatrixFormat::kRowwise &&
         lp.a_matrix_.isRowwise())) {
      // Incumbent format is OK
      *num_nz = lp.a_matrix_.numNz();
      if (a_start)
        memcpy(a_start, lp.a_matrix_.start_.data(),
               num_start_entries * sizeof(HighsInt));
      if (a_index)
        memcpy(a_index, lp.a_matrix_.index_.data(), *num_nz * sizeof(HighsInt));
      if (a_value)
        memcpy(a_value, lp.a_matrix_.value_.data(), *num_nz * sizeof(double));
    } else {
      // Take a copy and transpose it
      HighsSparseMatrix local_matrix = lp.a_matrix_;
      if (desired_a_format == MatrixFormat::kColwise) {
        assert(local_matrix.isRowwise());
        local_matrix.ensureColwise();
      } else {
        assert(local_matrix.isColwise());
        local_matrix.ensureRowwise();
      }
      *num_nz = local_matrix.numNz();
      if (a_start)
        memcpy(a_start, local_matrix.start_.data(),
               num_start_entries * sizeof(HighsInt));
      if (a_index)
        memcpy(a_index, local_matrix.index_.data(), *num_nz * sizeof(HighsInt));
      if (a_value)
        memcpy(a_value, local_matrix.value_.data(), *num_nz * sizeof(double));
    }
  }
  if (HighsInt(lp.integrality_.size()) && integrality) {
    for (int iCol = 0; iCol < *num_col; iCol++)
      integrality[iCol] = HighsInt(lp.integrality_[iCol]);
  }
  return kHighsStatusOk;
}